

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

bool Jinx::Impl::StringToValueType(String *value,ValueType *outValue)

{
  bool bVar1;
  ValueType *outValue_local;
  String *value_local;
  
  bVar1 = std::operator==(value,"null");
  if (bVar1) {
    *outValue = Null;
    value_local._7_1_ = true;
  }
  else {
    bVar1 = std::operator==(value,"number");
    if (bVar1) {
      *outValue = Number;
      value_local._7_1_ = true;
    }
    else {
      bVar1 = std::operator==(value,"integer");
      if (bVar1) {
        *outValue = Integer;
        value_local._7_1_ = true;
      }
      else {
        bVar1 = std::operator==(value,"boolean");
        if (bVar1) {
          *outValue = Boolean;
          value_local._7_1_ = true;
        }
        else {
          bVar1 = std::operator==(value,"string");
          if (bVar1) {
            *outValue = String;
            value_local._7_1_ = true;
          }
          else {
            bVar1 = std::operator==(value,"collection");
            if (bVar1) {
              *outValue = Collection;
              value_local._7_1_ = true;
            }
            else {
              bVar1 = std::operator==(value,"collectionitr");
              if (bVar1) {
                *outValue = CollectionItr;
                value_local._7_1_ = true;
              }
              else {
                bVar1 = std::operator==(value,"function");
                if (bVar1) {
                  *outValue = Function;
                  value_local._7_1_ = true;
                }
                else {
                  bVar1 = std::operator==(value,"buffer");
                  if (bVar1) {
                    *outValue = Buffer;
                    value_local._7_1_ = true;
                  }
                  else {
                    bVar1 = std::operator==(value,"guid");
                    if (bVar1) {
                      *outValue = Guid;
                      value_local._7_1_ = true;
                    }
                    else {
                      bVar1 = std::operator==(value,"valtype");
                      if (bVar1) {
                        *outValue = ValType;
                        value_local._7_1_ = true;
                      }
                      else {
                        value_local._7_1_ = false;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return value_local._7_1_;
}

Assistant:

inline bool StringToValueType(const String & value, ValueType * outValue)
	{
		if (value == "null")
		{
			*outValue = ValueType::Null;
			return true;
		}
		else if (value == "number")
		{
			*outValue = ValueType::Number;
			return true;
		}
		else if (value == "integer")
		{
			*outValue = ValueType::Integer;
			return true;
		}
		else if (value == "boolean")
		{
			*outValue = ValueType::Boolean;
			return true;
		}
		else if (value == "string")
		{
			*outValue = ValueType::String;
			return true;
		}
		else if (value == "collection")
		{
			*outValue = ValueType::Collection;
			return true;
		}
		else if (value == "collectionitr")
		{
			*outValue = ValueType::CollectionItr;
			return true;
		}
		else if (value == "function")
		{
			*outValue = ValueType::Function;
			return true;
		}
		else if (value == "buffer")
		{
			*outValue = ValueType::Buffer;
			return true;
		}
		else if (value == "guid")
		{
			*outValue = ValueType::Guid;
			return true;
		}
		else if (value == "valtype")
		{
			*outValue = ValueType::ValType;
			return true;
		}
		return false;
	}